

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86_avx512::forward
          (Eltwise_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  pointer pMVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [64];
  undefined1 (*pauVar9) [64];
  ulong uVar10;
  undefined1 (*pauVar11) [64];
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 in_ZMM3 [64];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->c;
  uVar16 = (ulong)uVar1;
  uVar7 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar12 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx512[-3]) == 0) {
      if (0 < (int)uVar1) {
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          pauVar8 = (undefined1 (*) [64])(m->cstep * uVar6 * m->elemsize + (long)m->data);
          pauVar9 = (undefined1 (*) [64])
                    (pMVar5[1].cstep * uVar6 * pMVar5[1].elemsize + (long)pMVar5[1].data);
          pauVar11 = (undefined1 (*) [64])
                     (this_00->cstep * uVar6 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar7 < 0x10) {
            uVar15 = 0;
          }
          else {
            iVar12 = 0xf;
            do {
              auVar17 = vmulps_avx512f(*pauVar9,*pauVar8);
              *pauVar11 = auVar17;
              pauVar8 = pauVar8 + 1;
              pauVar9 = pauVar9 + 1;
              pauVar11 = pauVar11 + 1;
              iVar12 = iVar12 + 0x10;
              uVar15 = uVar7 & 0xfffffff0;
            } while (iVar12 < (int)uVar7);
          }
          uVar14 = uVar15 | 7;
          while ((int)uVar14 < (int)uVar7) {
            auVar3._4_4_ = *(float *)(*pauVar9 + 4) * *(float *)(*pauVar8 + 4);
            auVar3._0_4_ = *(float *)*pauVar9 * *(float *)*pauVar8;
            auVar3._8_4_ = *(float *)(*pauVar9 + 8) * *(float *)(*pauVar8 + 8);
            auVar3._12_4_ = *(float *)(*pauVar9 + 0xc) * *(float *)(*pauVar8 + 0xc);
            auVar3._16_4_ = *(float *)(*pauVar9 + 0x10) * *(float *)(*pauVar8 + 0x10);
            auVar3._20_4_ = *(float *)(*pauVar9 + 0x14) * *(float *)(*pauVar8 + 0x14);
            auVar3._24_4_ = *(float *)(*pauVar9 + 0x18) * *(float *)(*pauVar8 + 0x18);
            auVar3._28_4_ = *(undefined4 *)(*pauVar9 + 0x1c);
            *(undefined1 (*) [32])*pauVar11 = auVar3;
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
            pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x20);
            uVar14 = uVar15 + 0xf;
            uVar15 = uVar15 + 8;
          }
          uVar14 = uVar15 | 3;
          while ((int)uVar14 < (int)uVar7) {
            auVar21._0_4_ = *(float *)*pauVar9 * *(float *)*pauVar8;
            auVar21._4_4_ = *(float *)(*pauVar9 + 4) * *(float *)(*pauVar8 + 4);
            auVar21._8_4_ = *(float *)(*pauVar9 + 8) * *(float *)(*pauVar8 + 8);
            auVar21._12_4_ = *(float *)(*pauVar9 + 0xc) * *(float *)(*pauVar8 + 0xc);
            *(undefined1 (*) [16])*pauVar11 = auVar21;
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
            pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x10);
            uVar14 = uVar15 + 7;
            uVar15 = uVar15 + 4;
          }
          if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
            lVar13 = 0;
            do {
              *(float *)((long)*pauVar11 + lVar13 * 4) =
                   *(float *)(*pauVar9 + lVar13 * 4) * *(float *)(*pauVar8 + lVar13 * 4);
              lVar13 = lVar13 + 1;
            } while (uVar7 - uVar15 != (int)lVar13);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar16);
      }
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar6 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar5 = pMVar5 + uVar6;
            uVar10 = 0;
            do {
              pauVar8 = (undefined1 (*) [64])
                        (pMVar5->cstep * uVar10 * pMVar5->elemsize + (long)pMVar5->data);
              pauVar9 = (undefined1 (*) [64])
                        (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
              uVar15 = 0;
              if (0xf < (int)uVar7) {
                iVar12 = 0xf;
                do {
                  auVar17 = vmulps_avx512f(*pauVar8,*pauVar9);
                  *pauVar9 = auVar17;
                  pauVar8 = pauVar8 + 1;
                  pauVar9 = pauVar9 + 1;
                  iVar12 = iVar12 + 0x10;
                  uVar15 = uVar7 & 0xfffffff0;
                } while (iVar12 < (int)uVar7);
              }
              uVar14 = uVar15 | 7;
              while ((int)uVar14 < (int)uVar7) {
                auVar4._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar9 + 4);
                auVar4._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar9;
                auVar4._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar9 + 8);
                auVar4._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar9 + 0xc);
                auVar4._16_4_ = *(float *)(*pauVar8 + 0x10) * *(float *)(*pauVar9 + 0x10);
                auVar4._20_4_ = *(float *)(*pauVar8 + 0x14) * *(float *)(*pauVar9 + 0x14);
                auVar4._24_4_ = *(float *)(*pauVar8 + 0x18) * *(float *)(*pauVar9 + 0x18);
                auVar4._28_4_ = *(undefined4 *)(*pauVar8 + 0x1c);
                *(undefined1 (*) [32])*pauVar9 = auVar4;
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
                uVar14 = uVar15 + 0xf;
                uVar15 = uVar15 + 8;
              }
              uVar14 = uVar15 | 3;
              while ((int)uVar14 < (int)uVar7) {
                auVar22._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar9;
                auVar22._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar9 + 4);
                auVar22._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar9 + 8);
                auVar22._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar9 + 0xc);
                *(undefined1 (*) [16])*pauVar9 = auVar22;
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
                uVar14 = uVar15 + 7;
                uVar15 = uVar15 + 4;
              }
              if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
                lVar13 = 0;
                do {
                  *(float *)(*pauVar9 + lVar13 * 4) =
                       *(float *)(*pauVar9 + lVar13 * 4) * *(float *)(*pauVar8 + lVar13 * 4);
                  lVar13 = lVar13 + 1;
                } while (uVar7 - uVar15 != (int)lVar13);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar16);
          }
          uVar6 = uVar6 + 1;
          pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx512[-3]) == 1) {
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)this->_vptr_Eltwise_x86_avx512[-3]) == 0) {
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            pauVar8 = (undefined1 (*) [64])(m->cstep * uVar6 * m->elemsize + (long)m->data);
            pauVar9 = (undefined1 (*) [64])
                      (pMVar5[1].cstep * uVar6 * pMVar5[1].elemsize + (long)pMVar5[1].data);
            pauVar11 = (undefined1 (*) [64])
                       (this_00->cstep * uVar6 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar7 < 0x10) {
              uVar15 = 0;
            }
            else {
              iVar12 = 0xf;
              do {
                auVar17 = vaddps_avx512f(*pauVar9,*pauVar8);
                *pauVar11 = auVar17;
                pauVar8 = pauVar8 + 1;
                pauVar9 = pauVar9 + 1;
                pauVar11 = pauVar11 + 1;
                iVar12 = iVar12 + 0x10;
                uVar15 = uVar7 & 0xfffffff0;
              } while (iVar12 < (int)uVar7);
            }
            uVar14 = uVar15 | 7;
            while ((int)uVar14 < (int)uVar7) {
              auVar26._0_4_ = *(float *)*pauVar9 + *(float *)*pauVar8;
              auVar26._4_4_ = *(float *)(*pauVar9 + 4) + *(float *)(*pauVar8 + 4);
              auVar26._8_4_ = *(float *)(*pauVar9 + 8) + *(float *)(*pauVar8 + 8);
              auVar26._12_4_ = *(float *)(*pauVar9 + 0xc) + *(float *)(*pauVar8 + 0xc);
              auVar26._16_4_ = *(float *)(*pauVar9 + 0x10) + *(float *)(*pauVar8 + 0x10);
              auVar26._20_4_ = *(float *)(*pauVar9 + 0x14) + *(float *)(*pauVar8 + 0x14);
              auVar26._24_4_ = *(float *)(*pauVar9 + 0x18) + *(float *)(*pauVar8 + 0x18);
              auVar26._28_4_ = *(float *)(*pauVar9 + 0x1c) + *(float *)(*pauVar8 + 0x1c);
              *(undefined1 (*) [32])*pauVar11 = auVar26;
              pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
              pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
              pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x20);
              uVar14 = uVar15 + 0xf;
              uVar15 = uVar15 + 8;
            }
            uVar14 = uVar15 | 3;
            while ((int)uVar14 < (int)uVar7) {
              auVar24._0_4_ = *(float *)*pauVar9 + *(float *)*pauVar8;
              auVar24._4_4_ = *(float *)(*pauVar9 + 4) + *(float *)(*pauVar8 + 4);
              auVar24._8_4_ = *(float *)(*pauVar9 + 8) + *(float *)(*pauVar8 + 8);
              auVar24._12_4_ = *(float *)(*pauVar9 + 0xc) + *(float *)(*pauVar8 + 0xc);
              *(undefined1 (*) [16])*pauVar11 = auVar24;
              pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
              pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
              pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x10);
              uVar14 = uVar15 + 7;
              uVar15 = uVar15 + 4;
            }
            if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
              lVar13 = 0;
              do {
                *(float *)((long)*pauVar11 + lVar13 * 4) =
                     *(float *)(*pauVar9 + lVar13 * 4) + *(float *)(*pauVar8 + lVar13 * 4);
                lVar13 = lVar13 + 1;
              } while (uVar7 - uVar15 != (int)lVar13);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar16);
        }
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar6 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar5 = pMVar5 + uVar6;
              uVar10 = 0;
              do {
                pauVar8 = (undefined1 (*) [64])
                          (pMVar5->cstep * uVar10 * pMVar5->elemsize + (long)pMVar5->data);
                pauVar9 = (undefined1 (*) [64])
                          (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
                uVar15 = 0;
                if (0xf < (int)uVar7) {
                  iVar12 = 0xf;
                  do {
                    auVar17 = vaddps_avx512f(*pauVar8,*pauVar9);
                    *pauVar9 = auVar17;
                    pauVar8 = pauVar8 + 1;
                    pauVar9 = pauVar9 + 1;
                    iVar12 = iVar12 + 0x10;
                    uVar15 = uVar7 & 0xfffffff0;
                  } while (iVar12 < (int)uVar7);
                }
                uVar14 = uVar15 | 7;
                while ((int)uVar14 < (int)uVar7) {
                  auVar27._0_4_ = *(float *)*pauVar8 + *(float *)*pauVar9;
                  auVar27._4_4_ = *(float *)(*pauVar8 + 4) + *(float *)(*pauVar9 + 4);
                  auVar27._8_4_ = *(float *)(*pauVar8 + 8) + *(float *)(*pauVar9 + 8);
                  auVar27._12_4_ = *(float *)(*pauVar8 + 0xc) + *(float *)(*pauVar9 + 0xc);
                  auVar27._16_4_ = *(float *)(*pauVar8 + 0x10) + *(float *)(*pauVar9 + 0x10);
                  auVar27._20_4_ = *(float *)(*pauVar8 + 0x14) + *(float *)(*pauVar9 + 0x14);
                  auVar27._24_4_ = *(float *)(*pauVar8 + 0x18) + *(float *)(*pauVar9 + 0x18);
                  auVar27._28_4_ = *(float *)(*pauVar8 + 0x1c) + *(float *)(*pauVar9 + 0x1c);
                  *(undefined1 (*) [32])*pauVar9 = auVar27;
                  pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                  pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
                  uVar14 = uVar15 + 0xf;
                  uVar15 = uVar15 + 8;
                }
                uVar14 = uVar15 | 3;
                while ((int)uVar14 < (int)uVar7) {
                  auVar25._0_4_ = *(float *)*pauVar8 + *(float *)*pauVar9;
                  auVar25._4_4_ = *(float *)(*pauVar8 + 4) + *(float *)(*pauVar9 + 4);
                  auVar25._8_4_ = *(float *)(*pauVar8 + 8) + *(float *)(*pauVar9 + 8);
                  auVar25._12_4_ = *(float *)(*pauVar8 + 0xc) + *(float *)(*pauVar9 + 0xc);
                  *(undefined1 (*) [16])*pauVar9 = auVar25;
                  pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                  pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
                  uVar14 = uVar15 + 7;
                  uVar15 = uVar15 + 4;
                }
                if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
                  lVar13 = 0;
                  do {
                    *(float *)(*pauVar9 + lVar13 * 4) =
                         *(float *)(*pauVar9 + lVar13 * 4) + *(float *)(*pauVar8 + lVar13 * 4);
                    lVar13 = lVar13 + 1;
                  } while (uVar7 - uVar15 != (int)lVar13);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar16);
            }
            uVar6 = uVar6 + 1;
            pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          } while (uVar6 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar1) {
          pp_Var2 = this->_vptr_Eltwise_x86_avx512;
          uVar6 = 0;
          do {
            pauVar8 = (undefined1 (*) [64])(m->cstep * uVar6 * m->elemsize + (long)m->data);
            pauVar9 = (undefined1 (*) [64])
                      (pMVar5[1].cstep * uVar6 * pMVar5[1].elemsize + (long)pMVar5[1].data);
            pauVar11 = (undefined1 (*) [64])
                       (this_00->cstep * uVar6 * this_00->elemsize + (long)this_00->data);
            uVar10 = **(ulong **)(&this->field_0xd8 + (long)pp_Var2[-3]);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = uVar10;
            auVar21 = vmovshdup_avx(auVar23);
            if ((int)uVar7 < 0x10) {
              uVar15 = 0;
            }
            else {
              auVar17 = vbroadcastss_avx512f(auVar23);
              in_ZMM3 = vbroadcastsd_avx512f(auVar21);
              iVar12 = 0xf;
              do {
                auVar18 = vmulps_avx512f(auVar17,*pauVar8);
                auVar18 = vfmadd231ps_avx512f(auVar18,in_ZMM3,*pauVar9);
                *pauVar11 = auVar18;
                pauVar8 = pauVar8 + 1;
                pauVar9 = pauVar9 + 1;
                pauVar11 = pauVar11 + 1;
                iVar12 = iVar12 + 0x10;
                uVar15 = uVar7 & 0xfffffff0;
              } while (iVar12 < (int)uVar7);
            }
            fVar19 = (float)uVar10;
            if ((int)(uVar15 | 7) < (int)uVar7) {
              auVar30._0_8_ = auVar21._0_8_;
              auVar30._8_8_ = auVar30._0_8_;
              auVar30._16_8_ = auVar30._0_8_;
              auVar30._24_8_ = auVar30._0_8_;
              uVar14 = uVar15;
              do {
                auVar17._0_4_ = fVar19 * *(float *)*pauVar8;
                auVar17._4_4_ = fVar19 * *(float *)(*pauVar8 + 4);
                auVar17._8_4_ = fVar19 * *(float *)(*pauVar8 + 8);
                auVar17._12_4_ = fVar19 * *(float *)(*pauVar8 + 0xc);
                auVar17._16_4_ = fVar19 * *(float *)(*pauVar8 + 0x10);
                auVar17._20_4_ = fVar19 * *(float *)(*pauVar8 + 0x14);
                auVar17._28_36_ = in_ZMM3._28_36_;
                auVar17._24_4_ = fVar19 * *(float *)(*pauVar8 + 0x18);
                auVar21 = vfmadd231ps_fma(auVar17._0_32_,auVar30,*(undefined1 (*) [32])*pauVar9);
                in_ZMM3 = ZEXT1664(auVar21);
                *(undefined1 (*) [32])*pauVar11 = ZEXT1632(auVar21);
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
                pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x20);
                uVar15 = uVar14 + 8;
                iVar12 = uVar14 + 0xf;
                uVar14 = uVar15;
              } while (iVar12 < (int)uVar7);
            }
            if ((int)(uVar15 | 3) < (int)uVar7) {
              auVar21 = vshufps_avx(auVar23,auVar23,0x55);
              uVar14 = uVar15;
              do {
                auVar32._0_4_ = fVar19 * *(float *)*pauVar8;
                auVar32._4_4_ = fVar19 * *(float *)(*pauVar8 + 4);
                auVar32._8_4_ = fVar19 * *(float *)(*pauVar8 + 8);
                auVar32._12_4_ = fVar19 * *(float *)(*pauVar8 + 0xc);
                auVar22 = vfmadd231ps_fma(auVar32,auVar21,*(undefined1 (*) [16])*pauVar9);
                in_ZMM3 = ZEXT1664(auVar22);
                *(undefined1 (*) [16])*pauVar11 = auVar22;
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
                pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x10);
                uVar15 = uVar14 + 4;
                iVar12 = uVar14 + 7;
                uVar14 = uVar15;
              } while (iVar12 < (int)uVar7);
            }
            if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
              lVar13 = 0;
              do {
                auVar21 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar8 + lVar13 * 4)),
                                        ZEXT416(*(uint *)(*pauVar9 + lVar13 * 4)),0x10);
                auVar28._0_4_ = auVar21._0_4_ * fVar19;
                auVar28._4_4_ = auVar21._4_4_ * (float)(uVar10 >> 0x20);
                auVar28._8_4_ = auVar21._8_4_ * 0.0;
                auVar28._12_4_ = auVar21._12_4_ * 0.0;
                auVar21 = vhaddps_avx(auVar28,auVar28);
                *(int *)((long)*pauVar11 + lVar13 * 4) = auVar21._0_4_;
                lVar13 = lVar13 + 1;
              } while (uVar7 - uVar15 != (int)lVar13);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar16);
        }
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
                       -0x71c71c71c71c71c7)) {
          pp_Var2 = this->_vptr_Eltwise_x86_avx512;
          uVar6 = 2;
          do {
            if (0 < (int)uVar1) {
              pMVar5 = pMVar5 + uVar6;
              uVar10 = 0;
              do {
                pauVar8 = (undefined1 (*) [64])
                          (pMVar5->cstep * uVar10 * pMVar5->elemsize + (long)pMVar5->data);
                pauVar9 = (undefined1 (*) [64])
                          (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
                auVar17 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)(*(long *)(&this->field_0xd8 +
                                                                (long)pp_Var2[-3]) + uVar6 * 4)));
                uVar15 = 0;
                if (0xf < (int)uVar7) {
                  iVar12 = 0xf;
                  do {
                    auVar18 = vfmadd213ps_avx512f(*pauVar8,auVar17,*pauVar9);
                    *pauVar9 = auVar18;
                    pauVar8 = pauVar8 + 1;
                    pauVar9 = pauVar9 + 1;
                    iVar12 = iVar12 + 0x10;
                    uVar15 = uVar7 & 0xfffffff0;
                  } while (iVar12 < (int)uVar7);
                }
                uVar20 = auVar17._0_4_;
                if ((int)(uVar15 | 7) < (int)uVar7) {
                  auVar31._4_4_ = uVar20;
                  auVar31._0_4_ = uVar20;
                  auVar31._8_4_ = uVar20;
                  auVar31._12_4_ = uVar20;
                  auVar31._16_4_ = uVar20;
                  auVar31._20_4_ = uVar20;
                  auVar31._24_4_ = uVar20;
                  auVar31._28_4_ = uVar20;
                  uVar14 = uVar15;
                  do {
                    auVar21 = vfmadd213ps_fma(*(undefined1 (*) [32])*pauVar8,auVar31,
                                              *(undefined1 (*) [32])*pauVar9);
                    *(undefined1 (*) [32])*pauVar9 = ZEXT1632(auVar21);
                    pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                    pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
                    uVar15 = uVar14 + 8;
                    iVar12 = uVar14 + 0xf;
                    uVar14 = uVar15;
                  } while (iVar12 < (int)uVar7);
                }
                if ((int)(uVar15 | 3) < (int)uVar7) {
                  auVar29._4_4_ = uVar20;
                  auVar29._0_4_ = uVar20;
                  auVar29._8_4_ = uVar20;
                  auVar29._12_4_ = uVar20;
                  uVar14 = uVar15;
                  do {
                    auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar8,auVar29,
                                              *(undefined1 (*) [16])*pauVar9);
                    *(undefined1 (*) [16])*pauVar9 = auVar21;
                    pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                    pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
                    uVar15 = uVar14 + 4;
                    iVar12 = uVar14 + 7;
                    uVar14 = uVar15;
                  } while (iVar12 < (int)uVar7);
                }
                if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
                  lVar13 = 0;
                  do {
                    auVar21 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar8 + lVar13 * 4)),
                                              auVar17._0_16_,
                                              ZEXT416(*(uint *)(*pauVar9 + lVar13 * 4)));
                    *(int *)(*pauVar9 + lVar13 * 4) = auVar21._0_4_;
                    lVar13 = lVar13 + 1;
                  } while (uVar7 - uVar15 != (int)lVar13);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar16);
            }
            uVar6 = uVar6 + 1;
            pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          } while (uVar6 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar12 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx512[-3]) == 2) {
      if (0 < (int)uVar1) {
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          pauVar8 = (undefined1 (*) [64])(m->cstep * uVar6 * m->elemsize + (long)m->data);
          pauVar9 = (undefined1 (*) [64])
                    (pMVar5[1].cstep * uVar6 * pMVar5[1].elemsize + (long)pMVar5[1].data);
          pauVar11 = (undefined1 (*) [64])
                     (this_00->cstep * uVar6 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar7 < 0x10) {
            uVar15 = 0;
          }
          else {
            iVar12 = 0xf;
            do {
              auVar17 = vmaxps_avx512f(*pauVar8,*pauVar9);
              *pauVar11 = auVar17;
              pauVar8 = pauVar8 + 1;
              pauVar9 = pauVar9 + 1;
              pauVar11 = pauVar11 + 1;
              iVar12 = iVar12 + 0x10;
              uVar15 = uVar7 & 0xfffffff0;
            } while (iVar12 < (int)uVar7);
          }
          uVar14 = uVar15 | 7;
          while ((int)uVar14 < (int)uVar7) {
            auVar3 = vmaxps_avx(*(undefined1 (*) [32])*pauVar8,*(undefined1 (*) [32])*pauVar9);
            *(undefined1 (*) [32])*pauVar11 = auVar3;
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
            pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x20);
            uVar14 = uVar15 + 0xf;
            uVar15 = uVar15 + 8;
          }
          uVar14 = uVar15 | 3;
          while ((int)uVar14 < (int)uVar7) {
            auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar8,*(undefined1 (*) [16])*pauVar9);
            *(undefined1 (*) [16])*pauVar11 = auVar21;
            pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
            pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
            pauVar11 = (undefined1 (*) [64])((long)*pauVar11 + 0x10);
            uVar14 = uVar15 + 7;
            uVar15 = uVar15 + 4;
          }
          if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
            lVar13 = 0;
            do {
              auVar21 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar9 + lVar13 * 4)),
                                   ZEXT416(*(uint *)(*pauVar8 + lVar13 * 4)));
              *(int *)((long)*pauVar11 + lVar13 * 4) = auVar21._0_4_;
              lVar13 = lVar13 + 1;
            } while (uVar7 - uVar15 != (int)lVar13);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar16);
      }
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = 0;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar6 = 2;
        do {
          if (0 < (int)uVar1) {
            pMVar5 = pMVar5 + uVar6;
            uVar10 = 0;
            do {
              pauVar8 = (undefined1 (*) [64])
                        (pMVar5->cstep * uVar10 * pMVar5->elemsize + (long)pMVar5->data);
              pauVar9 = (undefined1 (*) [64])
                        (this_00->cstep * uVar10 * this_00->elemsize + (long)this_00->data);
              uVar15 = 0;
              if (0xf < (int)uVar7) {
                iVar12 = 0xf;
                do {
                  auVar17 = vmaxps_avx512f(*pauVar9,*pauVar8);
                  *pauVar9 = auVar17;
                  pauVar8 = pauVar8 + 1;
                  pauVar9 = pauVar9 + 1;
                  iVar12 = iVar12 + 0x10;
                  uVar15 = uVar7 & 0xfffffff0;
                } while (iVar12 < (int)uVar7);
              }
              uVar14 = uVar15 | 7;
              while ((int)uVar14 < (int)uVar7) {
                auVar3 = vmaxps_avx(*(undefined1 (*) [32])*pauVar9,*(undefined1 (*) [32])*pauVar8);
                *(undefined1 (*) [32])*pauVar9 = auVar3;
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
                pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
                uVar14 = uVar15 + 0xf;
                uVar15 = uVar15 + 8;
              }
              uVar14 = uVar15 | 3;
              while ((int)uVar14 < (int)uVar7) {
                auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar9,*(undefined1 (*) [16])*pauVar8);
                *(undefined1 (*) [16])*pauVar9 = auVar21;
                pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
                pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
                uVar14 = uVar15 + 7;
                uVar15 = uVar15 + 4;
              }
              if (uVar7 - uVar15 != 0 && (int)uVar15 <= (int)uVar7) {
                lVar13 = 0;
                do {
                  auVar21 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar9 + lVar13 * 4)),
                                       ZEXT416(*(uint *)(*pauVar8 + lVar13 * 4)));
                  *(int *)(*pauVar9 + lVar13 * 4) = auVar21._0_4_;
                  lVar13 = lVar13 + 1;
                } while (uVar7 - uVar15 != (int)lVar13);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar16);
          }
          uVar6 = uVar6 + 1;
          pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >>
                                 3) * -0x71c71c71c71c71c7));
        iVar12 = 0;
      }
    }
  }
  return iVar12;
}

Assistant:

int Eltwise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}